

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

void Gyroid(void)

{
  vec3 p1;
  vec3 p2;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  Box local_38;
  
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::_Function_handler<double_(linalg::vec<double,_3>),_GyroidSDF>::_M_invoke;
  local_88 = std::_Function_handler<double_(linalg::vec<double,_3>),_GyroidSDF>::_M_manager;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_78 = 0x401921fb54442d18;
  uStack_70 = 0x401921fb54442d18;
  local_68 = 0x401921fb54442d18;
  p1.z = 0.0;
  p1.x = 0.0;
  p1.y = 0.0;
  p2.y = 6.283185307179586;
  p2.x = 6.283185307179586;
  p2.z = 6.283185307179586;
  manifold::Box::Box(&local_38,p1,p2);
  manifold::Manifold::LevelSet(0,0,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  return;
}

Assistant:

Manifold Gyroid() {
  const double period = kTwoPi;
  return Manifold::LevelSet(GyroidSDF(), {vec3(0.0), vec3(period)}, 0.5);
}